

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O0

string * __thiscall
QPDF::compute_encryption_key_from_password
          (string *__return_storage_ptr__,QPDF *this,string *password,EncryptionData *data)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  int *piVar6;
  allocator *md;
  size_t n;
  uchar *d;
  allocator local_8d;
  int local_8c;
  unsigned_long local_88;
  int local_80;
  int local_7c;
  uchar local_78 [4];
  int key_len;
  Digest digest;
  char bytes [4];
  int P;
  char pbytes [4];
  string local_50;
  undefined1 local_30 [8];
  MD5 md5;
  EncryptionData *data_local;
  string *password_local;
  
  md5.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)password;
  MD5::MD5((MD5 *)local_30,(uchar *)this,(size_t)password,(uchar *)data);
  pad_or_truncate_password_V4(&local_50,(string *)this);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  MD5::encodeDataIncrementally((MD5 *)local_30,pcVar4,0x20);
  std::__cxx11::string::~string((string *)&local_50);
  EncryptionData::getO_abi_cxx11_
            ((EncryptionData *)
             md5.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  MD5::encodeDataIncrementally((MD5 *)local_30,pcVar4,0x20);
  iVar2 = EncryptionData::getP
                    ((EncryptionData *)
                     md5.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
  digest[0xc] = (uchar)iVar2;
  bytes[0] = digest[0xc];
  digest[0xd] = (uchar)((uint)iVar2 >> 8);
  bytes[1] = digest[0xd];
  digest[0xe] = (uchar)((uint)iVar2 >> 0x10);
  bytes[2] = digest[0xe];
  digest[0xf] = (uchar)((uint)iVar2 >> 0x18);
  bytes[3] = digest[0xf];
  digest._12_4_ = iVar2;
  MD5::encodeDataIncrementally((MD5 *)local_30,bytes,4);
  EncryptionData::getId1_abi_cxx11_
            ((EncryptionData *)
             md5.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  EncryptionData::getId1_abi_cxx11_
            ((EncryptionData *)
             md5.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi);
  sVar5 = std::__cxx11::string::length();
  MD5::encodeDataIncrementally((MD5 *)local_30,pcVar4,sVar5);
  iVar2 = EncryptionData::getR
                    ((EncryptionData *)
                     md5.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
  if (3 < iVar2) {
    bVar1 = EncryptionData::getEncryptMetadata
                      ((EncryptionData *)
                       md5.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
    if (!bVar1) {
      digest[8] = 0xff;
      digest[9] = 0xff;
      digest[10] = 0xff;
      digest[0xb] = 0xff;
      MD5::encodeDataIncrementally((MD5 *)local_30,(char *)(digest + 8),4);
    }
  }
  local_88 = 0x10;
  local_80 = toI<unsigned_long>(&local_88);
  local_8c = EncryptionData::getLengthBytes
                       ((EncryptionData *)
                        md5.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi);
  piVar6 = std::min<int>(&local_80,&local_8c);
  local_7c = *piVar6;
  iVar3 = EncryptionData::getR
                    ((EncryptionData *)
                     md5.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
  iVar2 = 0;
  if (2 < iVar3) {
    iVar2 = 0x32;
  }
  iterate_md5_digest((MD5 *)local_30,(Digest *)local_78,iVar2,local_7c);
  d = local_78;
  sVar5 = toS<int>(&local_7c);
  md = &local_8d;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)d,sVar5,md);
  std::allocator<char>::~allocator((allocator<char> *)&local_8d);
  MD5::~MD5((MD5 *)local_30,d,n,(uchar *)md);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDF::compute_encryption_key_from_password(std::string const& password, EncryptionData const& data)
{
    // Algorithm 3.2 from the PDF 1.7 Reference Manual

    // This code does not properly handle Unicode passwords. Passwords are supposed to be converted
    // from OS codepage characters to PDFDocEncoding.  Unicode passwords are supposed to be
    // converted to OS codepage before converting to PDFDocEncoding.  We instead require the
    // password to be presented in its final form.

    MD5 md5;
    md5.encodeDataIncrementally(pad_or_truncate_password_V4(password).c_str(), key_bytes);
    md5.encodeDataIncrementally(data.getO().c_str(), key_bytes);
    char pbytes[4];
    int P = data.getP();
    pbytes[0] = static_cast<char>(P & 0xff);
    pbytes[1] = static_cast<char>((P >> 8) & 0xff);
    pbytes[2] = static_cast<char>((P >> 16) & 0xff);
    pbytes[3] = static_cast<char>((P >> 24) & 0xff);
    md5.encodeDataIncrementally(pbytes, 4);
    md5.encodeDataIncrementally(data.getId1().c_str(), data.getId1().length());
    if ((data.getR() >= 4) && (!data.getEncryptMetadata())) {
        char bytes[4];
        memset(bytes, 0xff, 4);
        md5.encodeDataIncrementally(bytes, 4);
    }
    MD5::Digest digest;
    int key_len = std::min(toI(sizeof(digest)), data.getLengthBytes());
    iterate_md5_digest(md5, digest, ((data.getR() >= 3) ? 50 : 0), key_len);
    return {reinterpret_cast<char*>(digest), toS(key_len)};
}